

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseMessageSetWithDuplicateTags<proto2_unittest::TestAllTypes>::TestBody
          (ParseMessageSetWithDuplicateTags<proto2_unittest::TestAllTypes> *this)

{
  uint uVar1;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  int extension_number;
  int extension_number_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  allocator<char> local_449;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  allocator<char> local_2f9;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  allocator<char> local_251;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  string other_message;
  string message;
  string other_id;
  string id;
  undefined1 local_50 [8];
  string end;
  string start;
  ParseMessageSetWithDuplicateTags<proto2_unittest::TestAllTypes> *this_local;
  
  BuildMessageSetItemStart_abi_cxx11_();
  BuildMessageSetItemEnd_abi_cxx11_();
  this_00 = proto2_unittest::TestMessageSetExtension1::descriptor();
  this_01 = Descriptor::extension(this_00,0);
  uVar1 = FieldDescriptor::number(this_01);
  BuildMessageSetItemTypeId_abi_cxx11_
            ((string *)((long)&other_id.field_2 + 8),(internal *)(ulong)uVar1,extension_number);
  BuildMessageSetItemTypeId_abi_cxx11_
            ((string *)((long)&message.field_2 + 8),(internal *)0x1e240,extension_number_00);
  WireFormatTest<proto2_unittest::TestAllTypes>::BuildMessageSetTestExtension1_abi_cxx11_
            ((string *)((long)&other_message.field_2 + 8),
             &this->super_WireFormatTest<proto2_unittest::TestAllTypes>,0x7b);
  WireFormatTest<proto2_unittest::TestAllTypes>::BuildMessageSetTestExtension1_abi_cxx11_
            ((string *)local_e0,&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,0x141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"id + other_id + message",&local_101);
  std::operator+(&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&end.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_id.field_2 + 8));
  std::operator+(&local_168,&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&message.field_2 + 8));
  std::operator+(&local_148,&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_message.field_2 + 8));
  std::operator+(&local_128,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_100,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"id + message + other_id",&local_1a9);
  std::operator+(&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&end.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_id.field_2 + 8));
  std::operator+(&local_210,&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_message.field_2 + 8));
  std::operator+(&local_1f0,&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&message.field_2 + 8));
  std::operator+(&local_1d0,&local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_1a8,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"message + id + other_id",&local_251);
  std::operator+(&local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&end.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_message.field_2 + 8));
  std::operator+(&local_2b8,&local_2d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_id.field_2 + 8));
  std::operator+(&local_298,&local_2b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&message.field_2 + 8));
  std::operator+(&local_278,&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_250,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"id + message + other_message",&local_2f9);
  std::operator+(&local_380,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&end.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_id.field_2 + 8));
  std::operator+(&local_360,&local_380,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_message.field_2 + 8));
  std::operator+(&local_340,&local_360,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  std::operator+(&local_320,&local_340,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_2f8,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"message + id + other_message",&local_3a1);
  std::operator+(&local_428,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&end.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_message.field_2 + 8));
  std::operator+(&local_408,&local_428,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_id.field_2 + 8));
  std::operator+(&local_3e8,&local_408,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  std::operator+(&local_3c8,&local_3e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_3a0,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"message + other_message + id",&local_449);
  std::operator+(&local_4d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&end.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_message.field_2 + 8));
  std::operator+(&local_4b0,&local_4d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  std::operator+(&local_490,&local_4b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&other_id.field_2 + 8));
  std::operator+(&local_470,&local_490,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  WireFormatTest<proto2_unittest::TestAllTypes>::ValidateTestMessageSet
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_448,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)(other_message.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(other_id.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(end.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseMessageSetWithDuplicateTags) {
  std::string start = BuildMessageSetItemStart();
  std::string end = BuildMessageSetItemEnd();
  std::string id = BuildMessageSetItemTypeId(
      TestFixture::TestMessageSetExtension1::descriptor()
          ->extension(0)
          ->number());
  std::string other_id = BuildMessageSetItemTypeId(123456);
  std::string message = this->BuildMessageSetTestExtension1();
  std::string other_message = this->BuildMessageSetTestExtension1(321);

  // Double id
  this->ValidateTestMessageSet("id + other_id + message",
                               start + id + other_id + message + end);
  this->ValidateTestMessageSet("id + message + other_id",
                               start + id + message + other_id + end);
  this->ValidateTestMessageSet("message + id + other_id",
                               start + message + id + other_id + end);
  // Double message
  this->ValidateTestMessageSet("id + message + other_message",
                               start + id + message + other_message + end);
  this->ValidateTestMessageSet("message + id + other_message",
                               start + message + id + other_message + end);
  this->ValidateTestMessageSet("message + other_message + id",
                               start + message + other_message + id + end);
}